

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem *items,int count,float width_excess)

{
  float fVar1;
  ulong uVar2;
  uint uVar3;
  int n;
  ulong uVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 in_register_00001384 [12];
  
  if (count == 1) {
    auVar7 = vmaxss_avx(ZEXT416((uint)(items->Width - width_excess)),ZEXT416(0x3f800000));
    items->Width = auVar7._0_4_;
  }
  else {
    qsort(items,(long)count,8,ShrinkWidthItemComparer);
    uVar4 = 1;
    auVar8 = ZEXT464((uint)width_excess);
    while (((int)uVar4 < count && (0.0 < auVar8._0_4_))) {
      fVar5 = items->Width;
      for (uVar2 = (ulong)(int)uVar4; uVar3 = (uint)uVar4, (long)uVar2 < (long)count;
          uVar2 = uVar2 + 1) {
        if (items[uVar2].Width < fVar5) {
          fVar5 = fVar5 - items[uVar2].Width;
          goto LAB_0020e957;
        }
        uVar4 = (ulong)(uVar3 + 1);
      }
      fVar5 = fVar5 + -1.0;
LAB_0020e957:
      auVar6._0_4_ = (float)(int)uVar2;
      auVar6._4_12_ = in_register_00001384;
      uVar4 = 0;
      auVar7._0_4_ = auVar8._0_4_ / auVar6._0_4_;
      auVar7._4_12_ = auVar8._4_12_;
      auVar7 = vminss_avx(auVar7,ZEXT416((uint)fVar5));
      for (; (~((int)uVar3 >> 0x1f) & uVar3) != uVar4; uVar4 = uVar4 + 1) {
        items[uVar4].Width = items[uVar4].Width - auVar7._0_4_;
      }
      auVar7 = vfnmadd231ss_fma(auVar8._0_16_,auVar7,auVar6);
      uVar4 = uVar2 & 0xffffffff;
      auVar8 = ZEXT1664(auVar7);
    }
    fVar5 = 0.0;
    uVar4 = (ulong)(uint)(~(count >> 0x1f) & count);
    for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      fVar1 = items[uVar2].Width;
      auVar7 = vcvtdq2ps_avx(ZEXT416((uint)(int)fVar1));
      items[uVar2].Width = auVar7._0_4_;
      fVar5 = fVar5 + (fVar1 - auVar7._0_4_);
    }
    if (0.0 < fVar5) {
      for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
        if (items[uVar2].Index < (int)(fVar5 + 0.01)) {
          items[uVar2].Width = items[uVar2].Width + 1.0;
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem* items, int count, float width_excess)
{
    if (count == 1)
    {
        items[0].Width = ImMax(items[0].Width - width_excess, 1.0f);
        return;
    }
    ImQsort(items, (size_t)count, sizeof(ImGuiShrinkWidthItem), ShrinkWidthItemComparer);
    int count_same_width = 1;
    while (width_excess > 0.0f && count_same_width < count)
    {
        while (count_same_width < count && items[0].Width <= items[count_same_width].Width)
            count_same_width++;
        float max_width_to_remove_per_item = (count_same_width < count) ? (items[0].Width - items[count_same_width].Width) : (items[0].Width - 1.0f);
        float width_to_remove_per_item = ImMin(width_excess / count_same_width, max_width_to_remove_per_item);
        for (int item_n = 0; item_n < count_same_width; item_n++)
            items[item_n].Width -= width_to_remove_per_item;
        width_excess -= width_to_remove_per_item * count_same_width;
    }

    // Round width and redistribute remainder left-to-right (could make it an option of the function?)
    // Ensure that e.g. the right-most tab of a shrunk tab-bar always reaches exactly at the same distance from the right-most edge of the tab bar separator.
    width_excess = 0.0f;
    for (int n = 0; n < count; n++)
    {
        float width_rounded = ImFloor(items[n].Width);
        width_excess += items[n].Width - width_rounded;
        items[n].Width = width_rounded;
    }
    if (width_excess > 0.0f)
        for (int n = 0; n < count; n++)
            if (items[n].Index < (int)(width_excess + 0.01f))
                items[n].Width += 1.0f;
}